

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ram_test.cc
# Opt level: O3

int main(void)

{
  pointer pRVar1;
  RamBindMFADeviceRequestType *this;
  pointer this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  HttpTestListener *pHVar3;
  HttpTestListener *pHVar4;
  undefined8 extraout_RAX;
  pointer pRVar5;
  RamClearAccountAliasResponseType resp_6;
  RamActivateServiceResponseType resp;
  RamActivateServiceRequestType req;
  RamCreateAccessKeyRequestType req_6;
  undefined7 *local_2b8;
  undefined8 local_2b0;
  undefined7 local_2a8;
  undefined1 uStack_2a1;
  undefined1 uStack_2a0;
  undefined1 uStack_29f;
  undefined1 uStack_29e;
  undefined1 local_29d;
  undefined1 local_298 [32];
  undefined1 local_278 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208;
  undefined6 uStack_207;
  undefined1 auStack_201 [4];
  undefined1 uStack_1fd;
  undefined4 uStack_1fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  char *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  undefined8 local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  undefined8 local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  undefined8 local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  undefined8 local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  local_218._8_8_ = 0;
  local_208 = 0;
  pRVar1 = (pointer)(local_f8 + 0x10);
  local_f8[0x10] = 'c';
  local_f8._17_6_ = 0x676e61682d6e;
  local_f8[0x17] = 'z';
  local_f8[0x18] = 'h';
  local_f8._25_2_ = 0x756f;
  local_f8._8_8_ = (pointer)0xb;
  local_f8[0x1b] = '\0';
  local_2a8 = 0x697070615f796d;
  uStack_2a1 = 100;
  local_2b0 = 8;
  uStack_2a0 = 0;
  pRVar5 = (pointer)(local_298 + 0x10);
  local_298._16_7_ = 0x726365735f796d;
  local_298[0x17] = 'e';
  local_298[0x18] = 't';
  local_298._8_8_ = 9;
  local_298[0x19] = '\0';
  local_2b8 = &local_2a8;
  local_298._0_8_ = pRVar5;
  local_218._M_allocated_capacity = (size_type)&local_208;
  local_f8._0_8_ = pRVar1;
  this = (RamBindMFADeviceRequestType *)aliyun::Ram::CreateRamClient(local_f8,&local_2b8,local_298);
  if ((pointer)local_298._0_8_ != pRVar5) {
    operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
  }
  if ((pointer)local_f8._0_8_ != pRVar1) {
    operator_delete((void *)local_f8._0_8_,
                    CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
  }
  if (this == (RamBindMFADeviceRequestType *)0x0) {
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    this = (RamBindMFADeviceRequestType *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (this != (RamBindMFADeviceRequestType *)0x0) goto LAB_0010f2cc;
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_1d8 = &local_1c8;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    this = (RamBindMFADeviceRequestType *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (this != (RamBindMFADeviceRequestType *)0x0) goto LAB_0010f3e3;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    this = (RamBindMFADeviceRequestType *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (this != (RamBindMFADeviceRequestType *)0x0) goto LAB_0010f50e;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    this = (RamBindMFADeviceRequestType *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (this != (RamBindMFADeviceRequestType *)0x0) goto LAB_0010f639;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    this = (RamBindMFADeviceRequestType *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (this != (RamBindMFADeviceRequestType *)0x0) goto LAB_0010f764;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_208 = 99;
    uStack_207 = 0x676e61682d6e;
    auStack_201 = (undefined1  [4])0x756f687a;
    local_218._8_8_ = 0xb;
    uStack_1fd = 0;
    local_f8[0x10] = 'm';
    local_f8._17_6_ = 0x697070615f79;
    local_f8[0x17] = 'd';
    local_f8._8_8_ = (pointer)0x8;
    local_f8[0x18] = '\0';
    local_2a8 = 0x726365735f796d;
    uStack_2a1 = 0x65;
    uStack_2a0 = 0x74;
    uStack_29f = 0;
    local_2b0 = 9;
    local_2b8 = &local_2a8;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    this_00 = (pointer)aliyun::Ram::CreateRamClient(&local_218,local_f8);
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if (this_00 != (pointer)0x0) goto LAB_0010f8a3;
    local_f8._0_8_ = local_f8 + 0x10;
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    this_00 = (pointer)aliyun::Ram::CreateRamClient(&local_2b8,local_298,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (this_00 != (pointer)0x0) goto LAB_0010f957;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
    this_00 = (pointer)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (this_00 != (pointer)0x0) goto LAB_0010fa70;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_c8._0_8_ = 0;
    local_c8[8] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
    local_d8._8_8_ = local_c8 + 8;
    this_00 = (pointer)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (this_00 != (pointer)0x0) goto LAB_0010fb9d;
    if ((undefined1 *)local_d8._8_8_ != local_c8 + 8) {
      operator_delete((void *)local_d8._8_8_,CONCAT71(local_c8._9_7_,local_c8[8]) + 1);
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_b8._8_8_ = 0;
    local_a8._M_local_buf[0] = '\0';
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_198._8_8_ = 0;
    local_188._M_local_buf[0] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
    this_00 = (pointer)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (this_00 != (pointer)0x0) goto LAB_0010fcf2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_allocated_capacity != &local_188) {
      operator_delete((void *)local_198._M_allocated_capacity,
                      CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,
                      CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    local_b8._8_8_ = 0;
    local_a8._M_local_buf[0] = '\0';
    local_1f8._8_8_ = local_1e8 + 8;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1e8._0_8_ = (pointer)0x0;
    local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
    local_1d0 = local_1c8._M_local_buf + 8;
    local_1c8._M_allocated_capacity = 0;
    local_1c8._M_local_buf[8] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
    this_00 = (pointer)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (this_00 != (pointer)0x0) goto LAB_0010fe33;
    if (local_1d0 != local_1c8._M_local_buf + 8) {
      operator_delete(local_1d0,CONCAT71(local_1c8._9_7_,local_1c8._M_local_buf[8]) + 1);
    }
    if ((undefined1 *)local_1f8._8_8_ != local_1e8 + 8) {
      operator_delete((void *)local_1f8._8_8_,
                      (ulong)((long)&(((string *)local_1e8._8_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,
                      CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    local_b8._8_8_ = 0;
    local_a8._M_local_buf[0] = '\0';
    local_178 = &local_168;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_local_buf[0] = '\0';
    local_170 = 0;
    local_168._M_local_buf[0] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_248._M_local_buf[9] = '\0';
    local_258._8_8_ = 9;
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
    this_00 = (pointer)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (this_00 != (pointer)0x0) goto LAB_0010ff74;
    if (local_178 != &local_168) {
      operator_delete(local_178,
                      CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]) + 1)
      ;
    }
    pRVar1 = (pointer)(local_f8 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_allocated_capacity != &local_188) {
      operator_delete((void *)local_198._M_allocated_capacity,
                      CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,
                      CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_98._M_allocated_capacity = (size_type)&local_88;
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    local_b8._8_8_ = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._8_8_ = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._8_8_ = 0;
    local_68._M_local_buf[0] = '\0';
    local_158 = &local_148;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_local_buf[0] = '\0';
    local_178 = &local_168;
    local_170 = 0;
    local_168._M_local_buf[0] = '\0';
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_248._M_local_buf[9] = '\0';
    local_258._8_8_ = 9;
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    local_78._M_allocated_capacity = (size_type)&local_68;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) goto LAB_001100b5;
    aliyun::RamCreateUserUserType::~RamCreateUserUserType((RamCreateUserUserType *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,
                      CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,
                      CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_0011021e;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110335;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110438;
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_0011054f;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110652;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110755;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110858;
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_0011096f;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110a72;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110b75;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110c78;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110da3;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110ece;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00110ff9;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298[0x19] = '\0';
    local_298._8_8_ = 9;
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_001110e5;
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_001111a7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = local_1e8 + 8;
    local_1e8._0_8_ = (pointer)0x0;
    local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_001112be;
    if ((undefined1 *)local_1f8._8_8_ != local_1e8 + 8) {
      operator_delete((void *)local_1f8._8_8_,
                      (ulong)((long)&(((string *)local_1e8._8_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_208 = 99;
    uStack_207 = 0x676e61682d6e;
    auStack_201 = (undefined1  [4])0x756f687a;
    local_218._8_8_ = 0xb;
    uStack_1fd = 0;
    local_f8[0x10] = 'm';
    local_f8._17_6_ = 0x697070615f79;
    local_f8[0x17] = 'd';
    local_f8._8_8_ = (pointer)0x8;
    local_f8[0x18] = '\0';
    local_2a8 = 0x726365735f796d;
    uStack_2a1 = 0x65;
    uStack_2a0 = 0x74;
    uStack_29f = 0;
    local_2b0 = 9;
    local_2b8 = &local_2a8;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_001113d5;
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_local_buf[0] = '\0';
    local_178 = &local_168;
    local_170 = 0;
    local_168._M_local_buf[0] = '\0';
    local_158 = &local_148;
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_248._M_local_buf[9] = '\0';
    local_258._8_8_ = 9;
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_0011148d;
    aliyun::RamGetPolicyPolicyType::~RamGetPolicyPolicyType((RamGetPolicyPolicyType *)&local_218);
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    local_b8._8_8_ = 0;
    local_a8._M_local_buf[0] = '\0';
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = local_1e8 + 8;
    local_1e8._0_8_ = (pointer)0x0;
    local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
    local_1d0 = local_1c8._M_local_buf + 8;
    local_1c8._M_allocated_capacity = 0;
    local_1c8._M_local_buf[8] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_001115b8;
    if (local_1d0 != local_1c8._M_local_buf + 8) {
      operator_delete(local_1d0,CONCAT71(local_1c8._9_7_,local_1c8._M_local_buf[8]) + 1);
    }
    if ((undefined1 *)local_1f8._8_8_ != local_1e8 + 8) {
      operator_delete((void *)local_1f8._8_8_,
                      (ulong)((long)&(((string *)local_1e8._8_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,
                      CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_local_buf[0] = '\0';
    local_178 = &local_168;
    local_170 = 0;
    local_168._M_local_buf[0] = '\0';
    local_158 = &local_148;
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_248._M_local_buf[9] = '\0';
    local_258._8_8_ = 9;
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_001116f7;
    aliyun::RamGetRoleRoleType::~RamGetRoleRoleType((RamGetRoleRoleType *)&local_218);
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_208 = 99;
    uStack_207 = 0x676e61682d6e;
    auStack_201 = (undefined1  [4])0x756f687a;
    local_218._8_8_ = 0xb;
    uStack_1fd = 0;
    local_f8[0x10] = 'm';
    local_f8._17_6_ = 0x697070615f79;
    local_f8[0x17] = 'd';
    local_f8._8_8_ = (pointer)0x8;
    local_f8[0x18] = '\0';
    local_2a8 = 0x726365735f796d;
    uStack_2a1 = 0x65;
    uStack_2a0 = 0x74;
    uStack_29f = 0;
    local_2b0 = 9;
    local_2b8 = &local_2a8;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_0011180e;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_001118c6;
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_138 = &local_128;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_local_buf[0] = '\0';
    local_178 = &local_168;
    local_170 = 0;
    local_168._M_local_buf[0] = '\0';
    local_158 = &local_148;
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_118 = &local_108;
    local_110 = 0;
    local_108._M_local_buf[0] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_248._M_local_buf[9] = '\0';
    local_258._8_8_ = 9;
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_001119dd;
    aliyun::RamGetUserUserType::~RamGetUserUserType((RamGetUserUserType *)&local_218);
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00111af4;
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_228._M_allocated_capacity = 0;
    local_238._M_allocated_capacity = 0;
    local_238._8_8_ = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00111c0b;
    std::
    vector<aliyun::RamListAccessKeysAccessKeyType,_std::allocator<aliyun::RamListAccessKeysAccessKeyType>_>
    ::~vector((vector<aliyun::RamListAccessKeysAccessKeyType,_std::allocator<aliyun::RamListAccessKeysAccessKeyType>_>
               *)&local_238);
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_1e8._0_8_ = (pointer)0x0;
    local_1e8._8_8_ = (pointer)0x0;
    local_1f8._M_allocated_capacity = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_208 = 0;
    uStack_207 = 0;
    auStack_201 = (undefined1  [4])0x0;
    uStack_1fd = 0;
    uStack_1fc = 0;
    local_218._M_allocated_capacity = 0;
    local_218._8_8_ = 0;
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_f8._0_8_ = pRVar1;
    pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar3 != (HttpTestListener *)0x0) goto LAB_00111d13;
    std::
    vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
    ::~vector((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
               *)local_1e8);
    std::
    vector<aliyun::RamListEntitiesForPolicyUserType,_std::allocator<aliyun::RamListEntitiesForPolicyUserType>_>
    ::~vector((vector<aliyun::RamListEntitiesForPolicyUserType,_std::allocator<aliyun::RamListEntitiesForPolicyUserType>_>
               *)(auStack_201 + 1));
    std::
    vector<aliyun::RamListEntitiesForPolicyGroupType,_std::allocator<aliyun::RamListEntitiesForPolicyGroupType>_>
    ::~vector((vector<aliyun::RamListEntitiesForPolicyGroupType,_std::allocator<aliyun::RamListEntitiesForPolicyGroupType>_>
               *)&local_218);
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_f8[0x10] = '\0';
    local_f8._17_6_ = 0;
    local_f8[0x17] = '\0';
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00111e3e;
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    std::vector<aliyun::RamListGroupsGroupType,_std::allocator<aliyun::RamListGroupsGroupType>_>::
    ~vector((vector<aliyun::RamListGroupsGroupType,_std::allocator<aliyun::RamListGroupsGroupType>_>
             *)local_f8);
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_228._M_allocated_capacity = 0;
    local_238._M_allocated_capacity = 0;
    local_238._8_8_ = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00111f6b;
    std::
    vector<aliyun::RamListGroupsForUserGroupType,_std::allocator<aliyun::RamListGroupsForUserGroupType>_>
    ::~vector((vector<aliyun::RamListGroupsForUserGroupType,_std::allocator<aliyun::RamListGroupsForUserGroupType>_>
               *)&local_238);
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_f8[0x10] = '\0';
    local_f8._17_6_ = 0;
    local_f8[0x17] = '\0';
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00112074;
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    std::
    vector<aliyun::RamListPoliciesPolicyType,_std::allocator<aliyun::RamListPoliciesPolicyType>_>::
    ~vector((vector<aliyun::RamListPoliciesPolicyType,_std::allocator<aliyun::RamListPoliciesPolicyType>_>
             *)local_f8);
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_228._M_allocated_capacity = 0;
    local_238._M_allocated_capacity = 0;
    local_238._8_8_ = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_001121b5;
    std::
    vector<aliyun::RamListPoliciesForGroupPolicyType,_std::allocator<aliyun::RamListPoliciesForGroupPolicyType>_>
    ::~vector((vector<aliyun::RamListPoliciesForGroupPolicyType,_std::allocator<aliyun::RamListPoliciesForGroupPolicyType>_>
               *)&local_238);
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_228._M_allocated_capacity = 0;
    local_238._M_allocated_capacity = 0;
    local_238._8_8_ = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_001122be;
    std::
    vector<aliyun::RamListPoliciesForRolePolicyType,_std::allocator<aliyun::RamListPoliciesForRolePolicyType>_>
    ::~vector((vector<aliyun::RamListPoliciesForRolePolicyType,_std::allocator<aliyun::RamListPoliciesForRolePolicyType>_>
               *)&local_238);
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_228._M_allocated_capacity = 0;
    local_238._M_allocated_capacity = 0;
    local_238._8_8_ = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_001123c7;
    std::
    vector<aliyun::RamListPoliciesForUserPolicyType,_std::allocator<aliyun::RamListPoliciesForUserPolicyType>_>
    ::~vector((vector<aliyun::RamListPoliciesForUserPolicyType,_std::allocator<aliyun::RamListPoliciesForUserPolicyType>_>
               *)&local_238);
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_228._M_allocated_capacity = 0;
    local_238._M_allocated_capacity = 0;
    local_238._8_8_ = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_001124d0;
    std::
    vector<aliyun::RamListPolicyVersionsPolicyVersionType,_std::allocator<aliyun::RamListPolicyVersionsPolicyVersionType>_>
    ::~vector((vector<aliyun::RamListPolicyVersionsPolicyVersionType,_std::allocator<aliyun::RamListPolicyVersionsPolicyVersionType>_>
               *)&local_238);
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_f8[0x10] = '\0';
    local_f8._17_6_ = 0;
    local_f8[0x17] = '\0';
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_001125ed;
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    std::vector<aliyun::RamListRolesRoleType,_std::allocator<aliyun::RamListRolesRoleType>_>::
    ~vector((vector<aliyun::RamListRolesRoleType,_std::allocator<aliyun::RamListRolesRoleType>_> *)
            local_f8);
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_f8[0x10] = '\0';
    local_f8._17_6_ = 0;
    local_f8[0x17] = '\0';
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_0011271a;
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    std::vector<aliyun::RamListUsersUserType,_std::allocator<aliyun::RamListUsersUserType>_>::
    ~vector((vector<aliyun::RamListUsersUserType,_std::allocator<aliyun::RamListUsersUserType>_> *)
            local_f8);
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_228._M_allocated_capacity = 0;
    local_238._M_allocated_capacity = 0;
    local_238._8_8_ = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00112847;
    std::
    vector<aliyun::RamListUsersForGroupUserType,_std::allocator<aliyun::RamListUsersForGroupUserType>_>
    ::~vector((vector<aliyun::RamListUsersForGroupUserType,_std::allocator<aliyun::RamListUsersForGroupUserType>_>
               *)&local_238);
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_278._0_8_ = (pointer)0x0;
    local_278._8_8_ = (pointer)0x0;
    local_278._16_2_ = 0;
    local_278[0x12] = '\0';
    local_278._19_4_ = 0;
    local_278[0x17] = '\0';
    local_208 = 99;
    uStack_207 = 0x676e61682d6e;
    auStack_201 = (undefined1  [4])0x756f687a;
    local_218._8_8_ = 0xb;
    uStack_1fd = 0;
    local_f8[0x10] = 'm';
    local_f8._17_6_ = 0x697070615f79;
    local_f8[0x17] = 'd';
    local_f8._8_8_ = (pointer)0x8;
    local_f8[0x18] = '\0';
    local_2a8 = 0x726365735f796d;
    uStack_2a1 = 0x65;
    uStack_2a0 = 0x74;
    local_2b0 = 9;
    uStack_29f = 0;
    local_2b8 = &local_2a8;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00112950;
    std::
    vector<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType,_std::allocator<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType>_>
    ::~vector((vector<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType,_std::allocator<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType>_>
               *)local_278);
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00112a39;
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00112b51;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00112c55;
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_local_buf[0] = '\0';
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00112d6d;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_allocated_capacity != &local_188) {
      operator_delete((void *)local_198._M_allocated_capacity,
                      CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00112ec6;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_00112fcf;
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_001130d3;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    local_b8._8_8_ = 0;
    local_a8._M_local_buf[0] = '\0';
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_258._8_8_ = 9;
    local_248._M_local_buf[9] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    local_f8._0_8_ = pRVar1;
    pHVar4 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (pHVar4 != (HttpTestListener *)0x0) goto LAB_001131ff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,
                      CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
    }
    if ((pointer)local_f8._0_8_ != pRVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8[0x17] = 'z';
    local_f8[0x18] = 'h';
    local_f8._25_2_ = 0x756f;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_2a8 = 0x697070615f796d;
    uStack_2a1 = 100;
    local_2b0 = 8;
    uStack_2a0 = 0;
    local_298._16_7_ = 0x726365735f796d;
    local_298[0x17] = 'e';
    local_298[0x18] = 't';
    local_298._8_8_ = 9;
    local_298[0x19] = '\0';
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    local_f8._0_8_ = pRVar1;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)aliyun::Ram::CreateRamClient(local_f8);
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) goto LAB_00113340;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
    }
    if ((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1f8._M_allocated_capacity !=
        (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
         *)local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_1e8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT17(auStack_201[0],CONCAT61(uStack_207,local_208)) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (undefined1 *)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    local_218._8_8_ = 0;
    local_208 = 0;
    local_1f8._8_8_ = (undefined1 *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1d8 = &local_1c8;
    local_1d0 = (char *)0x0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_local_buf[0] = '\0';
    local_178 = &local_168;
    local_170 = 0;
    local_168._M_local_buf[0] = '\0';
    local_158 = &local_148;
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_2a8 = 0x676e61682d6e63;
    uStack_2a1 = 0x7a;
    uStack_2a0 = 0x68;
    uStack_29f = 0x6f;
    uStack_29e = 0x75;
    local_2b0 = 0xb;
    local_29d = 0;
    local_298._16_7_ = 0x697070615f796d;
    local_298[0x17] = 'd';
    local_298._8_8_ = 8;
    local_298[0x18] = '\0';
    local_248._M_allocated_capacity._0_2_ = 0x796d;
    local_248._M_local_buf[2] = '_';
    local_248._M_allocated_capacity._3_4_ = 0x72636573;
    local_248._M_local_buf[7] = 'e';
    local_248._M_local_buf[8] = 't';
    local_248._M_local_buf[9] = '\0';
    local_258._8_8_ = 9;
    local_2b8 = &local_2a8;
    local_298._0_8_ = pRVar5;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_1f8._M_allocated_capacity =
         (size_type)
         (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
          *)local_1e8;
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
    }
    if (paVar2 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
      aliyun::RamUpdateRoleRoleType::~RamUpdateRoleRoleType((RamUpdateRoleRoleType *)&local_218);
      if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
        operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
      }
      if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_,
                        CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
      }
      local_218._8_8_ = 0;
      local_208 = 0;
      local_1f8._8_8_ = (undefined1 *)0x0;
      local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
      local_1d8 = &local_1c8;
      local_1d0 = (char *)0x0;
      local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
      local_1b8._M_allocated_capacity = (size_type)&local_1a8;
      local_1b8._8_8_ = 0;
      local_1a8._M_local_buf[0] = '\0';
      local_198._M_allocated_capacity = (size_type)&local_188;
      local_178 = &local_168;
      local_198._8_8_ = 0;
      local_188._M_local_buf[0] = '\0';
      local_170 = 0;
      local_168._M_local_buf[0] = '\0';
      local_158 = &local_148;
      local_150 = 0;
      local_148._M_local_buf[0] = '\0';
      local_138 = &local_128;
      local_2a8 = 0x676e61682d6e63;
      local_298._16_7_ = 0x697070615f796d;
      local_298[0x17] = 'd';
      local_f8._8_8_ = (pointer)0x0;
      local_f8[0x10] = '\0';
      local_d8._M_allocated_capacity = (size_type)local_c8;
      local_d8._8_8_ = (undefined1 *)0x0;
      local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
      local_b8._M_allocated_capacity = (size_type)&local_a8;
      local_b8._8_8_ = 0;
      local_a8._M_local_buf[0] = '\0';
      local_98._M_allocated_capacity = (size_type)&local_88;
      local_98._8_8_ = 0;
      local_88._M_local_buf[0] = '\0';
      local_78._8_8_ = 0;
      local_68._M_local_buf[0] = '\0';
      local_58._8_8_ = 0;
      local_48._M_local_buf[0] = '\0';
      local_130 = 0;
      local_128._M_local_buf[0] = '\0';
      uStack_2a1 = 0x7a;
      uStack_2a0 = 0x68;
      uStack_29f = 0x6f;
      uStack_29e = 0x75;
      local_2b0 = 0xb;
      local_29d = 0;
      local_298._8_8_ = 8;
      local_298[0x18] = '\0';
      local_248._M_allocated_capacity._0_2_ = 0x796d;
      local_248._M_local_buf[2] = '_';
      local_248._M_allocated_capacity._3_4_ = 0x72636573;
      local_248._M_local_buf[7] = 'e';
      local_248._M_local_buf[8] = 't';
      local_248._M_local_buf[9] = '\0';
      local_258._8_8_ = 9;
      local_2b8 = &local_2a8;
      local_298._0_8_ = pRVar5;
      local_258._M_allocated_capacity = (size_type)&local_248;
      local_218._M_allocated_capacity = (size_type)&local_208;
      local_1f8._M_allocated_capacity =
           (size_type)
           (vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
            *)local_1e8;
      local_f8._0_8_ = (pointer)(local_f8 + 0x10);
      local_78._M_allocated_capacity = (size_type)&local_68;
      local_58._M_allocated_capacity = (size_type)&local_48;
      pHVar3 = (HttpTestListener *)aliyun::Ram::CreateRamClient();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_allocated_capacity != &local_248) {
        operator_delete((void *)local_258._M_allocated_capacity,
                        CONCAT17(local_248._M_local_buf[7],
                                 CONCAT43(local_248._M_allocated_capacity._3_4_,
                                          CONCAT12(local_248._M_local_buf[2],
                                                   local_248._M_allocated_capacity._0_2_))) + 1);
      }
      if ((pointer)local_298._0_8_ != pRVar5) {
        operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,CONCAT17(uStack_2a1,local_2a8) + 1);
      }
      if (pHVar3 == (HttpTestListener *)0x0) {
        aliyun::RamUpdateUserUserType::~RamUpdateUserUserType((RamUpdateUserUserType *)&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_allocated_capacity != &local_48) {
          operator_delete((void *)local_58._M_allocated_capacity,
                          CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_allocated_capacity != &local_68) {
          operator_delete((void *)local_78._M_allocated_capacity,
                          CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_allocated_capacity != &local_88) {
          operator_delete((void *)local_98._M_allocated_capacity,
                          CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_allocated_capacity != &local_a8) {
          operator_delete((void *)local_b8._M_allocated_capacity,
                          CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) +
                          1);
        }
        if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
          operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
        }
        if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,
                          CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
        }
        return 0;
      }
      goto LAB_001135ad;
    }
  }
  else {
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(this->user_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->user_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"AccountId");
    aliyun::Ram::ActivateService
              ((RamActivateServiceRequestType *)this,
               (RamActivateServiceResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_1();
LAB_0010f2cc:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(this->user_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->user_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"GroupName");
    aliyun::Ram::AddUserToGroup
              ((RamAddUserToGroupRequestType *)this,
               (RamAddUserToGroupResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_2();
LAB_0010f3e3:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(this->user_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->user_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyType");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"PolicyName");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"GroupName");
    aliyun::Ram::AttachPolicyToGroup
              ((RamAttachPolicyToGroupRequestType *)this,
               (RamAttachPolicyToGroupResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_3();
LAB_0010f50e:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(this->user_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->user_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyType");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"PolicyName");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"RoleName");
    aliyun::Ram::AttachPolicyToRole
              ((RamAttachPolicyToRoleRequestType *)this,
               (RamAttachPolicyToRoleResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_4();
LAB_0010f639:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(this->user_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->user_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyType");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"PolicyName");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"UserName");
    aliyun::Ram::AttachPolicyToUser
              ((RamAttachPolicyToUserRequestType *)this,
               (RamAttachPolicyToUserResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_5();
LAB_0010f764:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(this->user_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->user_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    this_00 = (pointer)(local_278 + 0x10);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = this_00;
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != this_00) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"SerialNumber");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"UserName");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"AuthenticationCode1");
    std::__cxx11::string::operator=((string *)local_1b8._M_local_buf,"AuthenticationCode2");
    aliyun::Ram::BindMFADevice
              (this,(RamBindMFADeviceResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_6();
LAB_0010f8a3:
    local_298._16_7_ = 0x302e302e373231;
    local_298[0x17] = '.';
    local_298[0x18] = '1';
    local_298[0x19] = ':';
    local_298._26_5_ = 0x3433323231;
    local_298._8_8_ = 0xf;
    local_298[0x1f] = '\0';
    local_298._0_8_ = pRVar5;
    aliyun::Ram::SetProxyHost((Ram *)this_00,(string *)local_298);
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if ((char)(this_00->user).user_name._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->user).user_name._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_248._M_allocated_capacity._0_2_ = 0x7d7b;
    local_258._8_8_ = 2;
    local_248._M_local_buf[2] = '\0';
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_258);
    main_cold_7();
LAB_0010f957:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)this_00,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->user).user_name._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->user).user_name._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"AccessKey\": {    \"AccessKeyId\": \"AccessKeyId\",    \"AccessKeySecret\": \"AccessKeySecret\",    \"Status\": \"Status\",    \"CreateDate\": \"CreateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_f8,"UserName");
    aliyun::Ram::CreateAccessKey
              ((RamCreateAccessKeyRequestType *)this_00,(RamCreateAccessKeyResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_8();
LAB_0010fa70:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)this_00,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->user).user_name._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->user).user_name._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Group\": {    \"GroupName\": \"GroupName\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_f8,"GroupName");
    std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"Comments");
    aliyun::Ram::CreateGroup
              ((RamCreateGroupRequestType *)this_00,(RamCreateGroupResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_9();
LAB_0010fb9d:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)this_00,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->user).user_name._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->user).user_name._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"LoginProfile\": {    \"UserName\": \"UserName\",    \"PasswordResetRequired\": true,    \"MFABindRequired\": true,    \"CreateDate\": \"CreateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"Password");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"PasswordResetRequired");
    std::__cxx11::string::operator=((string *)local_1b8._M_local_buf,"MFABindRequired");
    aliyun::Ram::CreateLoginProfile
              ((RamCreateLoginProfileRequestType *)this_00,
               (RamCreateLoginProfileResponseType *)&local_218,(RamErrorInfo *)local_f8);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_10();
LAB_0010fcf2:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)this_00,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->user).user_name._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->user).user_name._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Policy\": {    \"PolicyName\": \"PolicyName\",    \"PolicyType\": \"PolicyType\",    \"Description\": \"Description\",    \"DefaultVersion\": \"DefaultVersion\",    \"CreateDate\": \"CreateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_f8,"PolicyName");
    std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"Description");
    std::__cxx11::string::operator=((string *)local_b8._M_local_buf,"PolicyDocument");
    aliyun::Ram::CreatePolicy
              ((RamCreatePolicyRequestType *)this_00,(RamCreatePolicyResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_11();
LAB_0010fe33:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)this_00,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->user).user_name._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->user).user_name._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"PolicyVersion\": {    \"VersionId\": \"VersionId\",    \"IsDefaultVersion\": true,    \"PolicyDocument\": \"PolicyDocument\",    \"CreateDate\": \"CreateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_f8,"PolicyName");
    std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"PolicyDocument");
    std::__cxx11::string::operator=((string *)local_b8._M_local_buf,"SetAsDefault");
    aliyun::Ram::CreatePolicyVersion
              ((RamCreatePolicyVersionRequestType *)this_00,
               (RamCreatePolicyVersionResponseType *)local_f8,(RamErrorInfo *)local_218._M_local_buf
              );
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_12();
LAB_0010ff74:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)this_00,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->user).user_name._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->user).user_name._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    paVar2 = &local_228;
    local_238._M_allocated_capacity = (size_type)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Role\": {    \"RoleId\": \"RoleId\",    \"RoleName\": \"RoleName\",    \"Arn\": \"Arn\",    \"Description\": \"Description\",    \"AssumeRolePolicyDocument\": \"AssumeRolePolicyDocument\",    \"CreateDate\": \"CreateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != paVar2) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_f8,"RoleName");
    std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"Description");
    std::__cxx11::string::operator=((string *)local_b8._M_local_buf,"AssumeRolePolicyDocument");
    aliyun::Ram::CreateRole
              ((RamCreateRoleRequestType *)this_00,(RamCreateRoleResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_13();
LAB_001100b5:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)paVar2->_M_local_buf,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if (paVar2->_M_local_buf[0x28] == '\x01') {
      paVar2->_M_local_buf[0x29] = '\0';
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"User\": {    \"UserId\": \"UserId\",    \"UserName\": \"UserName\",    \"DisplayName\": \"DisplayName\",    \"MobilePhone\": \"MobilePhone\",    \"Email\": \"Email\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_f8,"UserName");
    std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"DisplayName");
    std::__cxx11::string::operator=((string *)local_b8._M_local_buf,"MobilePhone");
    std::__cxx11::string::operator=((string *)local_98._M_local_buf,"Email");
    std::__cxx11::string::operator=((string *)local_78._M_local_buf,"Comments");
    aliyun::Ram::CreateUser
              ((RamCreateUserRequestType *)paVar2,(RamCreateUserResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_14();
LAB_0011021e:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"VirtualMFADevice\": {    \"SerialNumber\": \"SerialNumber\",    \"Base32StringSeed\": \"Base32StringSeed\",    \"QRCodePNG\": \"QRCodePNG\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_f8,"VirtualMFADeviceName");
    aliyun::Ram::CreateVirtualMFADevice
              ((RamCreateVirtualMFADeviceRequestType *)pHVar3,
               (RamCreateVirtualMFADeviceResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_15();
LAB_00110335:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"AccountId");
    aliyun::Ram::DeactivateService
              ((RamDeactivateServiceRequestType *)pHVar3,
               (RamDeactivateServiceResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_16();
LAB_00110438:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"UserAccessKeyId");
    aliyun::Ram::DeleteAccessKey
              ((RamDeleteAccessKeyRequestType *)pHVar3,
               (RamDeleteAccessKeyResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_17();
LAB_0011054f:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"GroupName");
    aliyun::Ram::DeleteGroup
              ((RamDeleteGroupRequestType *)pHVar3,
               (RamDeleteGroupResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_18();
LAB_00110652:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    aliyun::Ram::DeleteLoginProfile
              ((RamDeleteLoginProfileRequestType *)pHVar3,
               (RamDeleteLoginProfileResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_19();
LAB_00110755:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyName");
    aliyun::Ram::DeletePolicy
              ((RamDeletePolicyRequestType *)pHVar3,
               (RamDeletePolicyResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_20();
LAB_00110858:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyName");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"VersionId");
    aliyun::Ram::DeletePolicyVersion
              ((RamDeletePolicyVersionRequestType *)pHVar3,
               (RamDeletePolicyVersionResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_21();
LAB_0011096f:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"RoleName");
    aliyun::Ram::DeleteRole
              ((RamDeleteRoleRequestType *)pHVar3,
               (RamDeleteRoleResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_22();
LAB_00110a72:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    aliyun::Ram::DeleteUser
              ((RamDeleteUserRequestType *)pHVar3,
               (RamDeleteUserResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_23();
LAB_00110b75:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"SerialNumber");
    aliyun::Ram::DeleteVirtualMFADevice
              ((RamDeleteVirtualMFADeviceRequestType *)pHVar3,
               (RamDeleteVirtualMFADeviceResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_24();
LAB_00110c78:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyType");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"PolicyName");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"GroupName");
    aliyun::Ram::DetachPolicyFromGroup
              ((RamDetachPolicyFromGroupRequestType *)pHVar3,
               (RamDetachPolicyFromGroupResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_25();
LAB_00110da3:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyType");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"PolicyName");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"RoleName");
    aliyun::Ram::DetachPolicyFromRole
              ((RamDetachPolicyFromRoleRequestType *)pHVar3,
               (RamDetachPolicyFromRoleResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_26();
LAB_00110ece:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyType");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"PolicyName");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"UserName");
    aliyun::Ram::DetachPolicyFromUser
              ((RamDetachPolicyFromUserRequestType *)pHVar3,
               (RamDetachPolicyFromUserResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_27();
LAB_00110ff9:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"{  \"AccountAlias\": \"AccountAlias\"}","");
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    aliyun::Ram::GetAccountAlias
              ((RamGetAccountAliasResponseType *)pHVar3,(RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_28();
LAB_001110e5:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    pRVar5 = (pointer)(local_278 + 0x10);
    local_278._0_8_ = pRVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "{  \"SummaryMap\": {    \"UsersQuota\": 0,    \"Users\": 0,    \"AccessKeysPerUserQuota\": 0,    \"VirtualMFADevicesQuota\": 0,    \"MFADevices\": 0,    \"MFADevicesInUse\": 0,    \"GroupsQuota\": 0,    \"Groups\": 0,    \"GroupsPerUserQuota\": 0,    \"RolesQuota\": 0,    \"Roles\": 0,    \"PoliciesQuota\": 0,    \"Policies\": 0,    \"PolicySizeQuota\": 0,    \"VersionsPerPolicyQuota\": 0,    \"AttachedPoliciesPerUserQuota\": 0,    \"AttachedPoliciesPerGroupQuota\": 0,    \"AttachedPoliciesPerRoleQuota\": 0  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    main_cold_29();
LAB_001111a7:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Group\": {    \"GroupName\": \"GroupName\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_f8,"GroupName");
    aliyun::Ram::GetGroup
              ((RamGetGroupRequestType *)pHVar3,(RamGetGroupResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_30();
LAB_001112be:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"LoginProfile\": {    \"UserName\": \"UserName\",    \"PasswordResetRequired\": true,    \"MFABindRequired\": true,    \"CreateDate\": \"CreateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_f8,"UserName");
    aliyun::Ram::GetLoginProfile
              ((RamGetLoginProfileRequestType *)pHVar3,(RamGetLoginProfileResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_31();
LAB_001113d5:
    local_298._16_7_ = 0x302e302e373231;
    local_298[0x17] = '.';
    local_298[0x18] = '1';
    local_298[0x19] = ':';
    local_298._26_5_ = 0x3433323231;
    local_298._8_8_ = 0xf;
    local_298[0x1f] = '\0';
    local_298._0_8_ = pRVar5;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_298);
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_258._M_allocated_capacity = (size_type)&local_248;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "{  \"PasswordPolicy\": {    \"MinimumPasswordLength\": 0,    \"RequireLowercaseCharacters\": true,    \"RequireUppercaseCharacters\": true,    \"RequireNumbers\": true,    \"RequireSymbols\": true  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_258);
    main_cold_32();
LAB_0011148d:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Policy\": {    \"PolicyName\": \"PolicyName\",    \"PolicyType\": \"PolicyType\",    \"Description\": \"Description\",    \"DefaultVersion\": \"DefaultVersion\",    \"PolicyDocument\": \"PolicyDocument\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\",    \"AttachmentCount\": 0  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_f8,"PolicyType");
    std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"PolicyName");
    aliyun::Ram::GetPolicy
              ((RamGetPolicyRequestType *)pHVar3,(RamGetPolicyResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_33();
LAB_001115b8:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"PolicyVersion\": {    \"VersionId\": \"VersionId\",    \"IsDefaultVersion\": true,    \"PolicyDocument\": \"PolicyDocument\",    \"CreateDate\": \"CreateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_f8,"PolicyType");
    std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"PolicyName");
    std::__cxx11::string::operator=((string *)local_b8._M_local_buf,"VersionId");
    aliyun::Ram::GetPolicyVersion
              ((RamGetPolicyVersionRequestType *)pHVar3,(RamGetPolicyVersionResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_34();
LAB_001116f7:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Role\": {    \"RoleId\": \"RoleId\",    \"RoleName\": \"RoleName\",    \"Arn\": \"Arn\",    \"Description\": \"Description\",    \"AssumeRolePolicyDocument\": \"AssumeRolePolicyDocument\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_f8,"RoleName");
    aliyun::Ram::GetRole
              ((RamGetRoleRequestType *)pHVar3,(RamGetRoleResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_35();
LAB_0011180e:
    local_298._16_7_ = 0x302e302e373231;
    local_298[0x17] = '.';
    local_298[0x18] = '1';
    local_298[0x19] = ':';
    local_298._26_5_ = 0x3433323231;
    local_298._8_8_ = 0xf;
    local_298[0x1f] = '\0';
    local_298._0_8_ = pRVar5;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_298);
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_258._M_allocated_capacity = (size_type)&local_248;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "{  \"SecurityPreference\": {    \"LoginProfilePreference\": {      \"EnableSaveMFATicket\": true    }  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_258);
    main_cold_36();
LAB_001118c6:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"{  \"Status\": \"Status\"}","");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"AccountId");
    aliyun::Ram::GetServiceStatus
              ((RamGetServiceStatusRequestType *)pHVar3,
               (RamGetServiceStatusResponseType *)&local_218,(RamErrorInfo *)local_f8);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_37();
LAB_001119dd:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"User\": {    \"UserId\": \"UserId\",    \"UserName\": \"UserName\",    \"DisplayName\": \"DisplayName\",    \"MobilePhone\": \"MobilePhone\",    \"Email\": \"Email\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\",    \"LastLoginDate\": \"LastLoginDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_f8,"UserName");
    aliyun::Ram::GetUser
              ((RamGetUserRequestType *)pHVar3,(RamGetUserResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_38();
LAB_00111af4:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"{  \"MFADevice\": {    \"SerialNumber\": \"SerialNumber\"  }}",
               "");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    aliyun::Ram::GetUserMFAInfo
              ((RamGetUserMFAInfoRequestType *)pHVar3,(RamGetUserMFAInfoResponseType *)&local_218,
               (RamErrorInfo *)local_f8);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_39();
LAB_00111c0b:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "{  \"AccessKeys\": {    \"AccessKey\": [      {        \"AccessKeyId\": \"AccessKeyId\",        \"Status\": \"Status\",        \"CreateDate\": \"CreateDate\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    aliyun::Ram::ListAccessKeys
              ((RamListAccessKeysRequestType *)pHVar3,(RamListAccessKeysResponseType *)&local_218,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_40();
LAB_00111d13:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Groups\": {    \"Group\": [      {        \"GroupName\": \"GroupName\",        \"Comments\": \"Comments\",        \"AttachDate\": \"AttachDate\"      }    ]  },  \"Users\": {    \"User\": [      {        \"UserId\": \"UserId\",        \"UserName\": \"UserName\",        \"DisplayName\": \"DisplayName\",        \"AttachDate\": \"AttachDate\"      }    ]  },  \"Roles\": {    \"Role\": [      {        \"RoleId\": \"RoleId\",        \"RoleName\": \"RoleName\",        \"Arn\": \"Arn\",        \"Description\": \"Description\",        \"AttachDate\": \"AttachDate\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_f8,"PolicyType");
    std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"PolicyName");
    aliyun::Ram::ListEntitiesForPolicy
              ((RamListEntitiesForPolicyRequestType *)pHVar3,
               (RamListEntitiesForPolicyResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_41();
LAB_00111e3e:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Groups\": {    \"Group\": [      {        \"GroupName\": \"GroupName\",        \"Comments\": \"Comments\",        \"CreateDate\": \"CreateDate\",        \"UpdateDate\": \"UpdateDate\"      }    ]  },  \"IsTruncated\": true,  \"Marker\": \"Marker\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"Marker");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"MaxItems");
    aliyun::Ram::ListGroups
              ((RamListGroupsRequestType *)pHVar4,(RamListGroupsResponseType *)&local_218,
               (RamErrorInfo *)local_f8);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_42();
LAB_00111f6b:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "{  \"Groups\": {    \"Group\": [      {        \"GroupName\": \"GroupName\",        \"Comments\": \"Comments\",        \"JoinDate\": \"JoinDate\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    aliyun::Ram::ListGroupsForUser
              ((RamListGroupsForUserRequestType *)pHVar4,
               (RamListGroupsForUserResponseType *)&local_218,(RamErrorInfo *)local_238._M_local_buf
              );
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_43();
LAB_00112074:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Policies\": {    \"Policy\": [      {        \"PolicyName\": \"PolicyName\",        \"PolicyType\": \"PolicyType\",        \"Description\": \"Description\",        \"DefaultVersion\": \"DefaultVersion\",        \"CreateDate\": \"CreateDate\",        \"UpdateDate\": \"UpdateDate\",        \"AttachmentCount\": 0      }    ]  },  \"IsTruncated\": true,  \"Marker\": \"Marker\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyType");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"Marker");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"MaxItems");
    aliyun::Ram::ListPolicies
              ((RamListPoliciesRequestType *)pHVar4,(RamListPoliciesResponseType *)&local_218,
               (RamErrorInfo *)local_f8);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_44();
LAB_001121b5:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "{  \"Policies\": {    \"Policy\": [      {        \"PolicyName\": \"PolicyName\",        \"PolicyType\": \"PolicyType\",        \"Description\": \"Description\",        \"DefaultVersion\": \"DefaultVersion\",        \"AttachDate\": \"AttachDate\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"GroupName");
    aliyun::Ram::ListPoliciesForGroup
              ((RamListPoliciesForGroupRequestType *)pHVar4,
               (RamListPoliciesForGroupResponseType *)&local_218,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_45();
LAB_001122be:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "{  \"Policies\": {    \"Policy\": [      {        \"PolicyName\": \"PolicyName\",        \"PolicyType\": \"PolicyType\",        \"Description\": \"Description\",        \"DefaultVersion\": \"DefaultVersion\",        \"AttachDate\": \"AttachDate\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"RoleName");
    aliyun::Ram::ListPoliciesForRole
              ((RamListPoliciesForRoleRequestType *)pHVar4,
               (RamListPoliciesForRoleResponseType *)&local_218,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_46();
LAB_001123c7:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "{  \"Policies\": {    \"Policy\": [      {        \"PolicyName\": \"PolicyName\",        \"PolicyType\": \"PolicyType\",        \"Description\": \"Description\",        \"DefaultVersion\": \"DefaultVersion\",        \"AttachDate\": \"AttachDate\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    aliyun::Ram::ListPoliciesForUser
              ((RamListPoliciesForUserRequestType *)pHVar4,
               (RamListPoliciesForUserResponseType *)&local_218,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_47();
LAB_001124d0:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "{  \"PolicyVersions\": {    \"PolicyVersion\": [      {        \"VersionId\": \"VersionId\",        \"IsDefaultVersion\": true,        \"PolicyDocument\": \"PolicyDocument\",        \"CreateDate\": \"CreateDate\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyType");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"PolicyName");
    aliyun::Ram::ListPolicyVersions
              ((RamListPolicyVersionsRequestType *)pHVar4,
               (RamListPolicyVersionsResponseType *)&local_218,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_48();
LAB_001125ed:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Roles\": {    \"Role\": [      {        \"RoleId\": \"RoleId\",        \"RoleName\": \"RoleName\",        \"Arn\": \"Arn\",        \"Description\": \"Description\",        \"CreateDate\": \"CreateDate\",        \"UpdateDate\": \"UpdateDate\"      }    ]  },  \"IsTruncated\": true,  \"Marker\": \"Marker\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"Marker");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"MaxItems");
    aliyun::Ram::ListRoles
              ((RamListRolesRequestType *)pHVar4,(RamListRolesResponseType *)&local_218,
               (RamErrorInfo *)local_f8);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_49();
LAB_0011271a:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_238._M_allocated_capacity = (size_type)&local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Users\": {    \"User\": [      {        \"UserId\": \"UserId\",        \"UserName\": \"UserName\",        \"DisplayName\": \"DisplayName\",        \"MobilePhone\": \"MobilePhone\",        \"Email\": \"Email\",        \"Comments\": \"Comments\",        \"CreateDate\": \"CreateDate\",        \"UpdateDate\": \"UpdateDate\"      }    ]  },  \"IsTruncated\": true,  \"Marker\": \"Marker\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"Marker");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"MaxItems");
    aliyun::Ram::ListUsers
              ((RamListUsersRequestType *)pHVar4,(RamListUsersResponseType *)&local_218,
               (RamErrorInfo *)local_f8);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_50();
LAB_00112847:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "{  \"Users\": {    \"User\": [      {        \"UserName\": \"UserName\",        \"DisplayName\": \"DisplayName\",        \"JoinDate\": \"JoinDate\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"GroupName");
    aliyun::Ram::ListUsersForGroup
              ((RamListUsersForGroupRequestType *)pHVar4,
               (RamListUsersForGroupResponseType *)&local_218,(RamErrorInfo *)local_238._M_local_buf
              );
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_51();
LAB_00112950:
    local_298._16_7_ = 0x302e302e373231;
    local_298[0x17] = '.';
    local_298[0x18] = '1';
    local_298[0x19] = ':';
    local_298._26_5_ = 0x3433323231;
    local_298._8_8_ = 0xf;
    local_298[0x1f] = '\0';
    local_298._0_8_ = pRVar5;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)local_298);
    if ((pointer)local_298._0_8_ != pRVar5) {
      operator_delete((void *)local_298._0_8_,CONCAT17(local_298[0x17],local_298._16_7_) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_258._M_allocated_capacity = (size_type)&local_248;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "{  \"VirtualMFADevices\": {    \"VirtualMFADevice\": [      {        \"User\": {          \"UserId\": \"UserId\",          \"UserName\": \"UserName\",          \"DisplayName\": \"DisplayName\"        },        \"SerialNumber\": \"SerialNumber\",        \"ActivateDate\": \"ActivateDate\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    HttpTestListener::Start(pHVar3);
    aliyun::Ram::ListVirtualMFADevices
              ((RamListVirtualMFADevicesResponseType *)pHVar4,(RamErrorInfo *)local_278);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_52();
LAB_00112a39:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"GroupName");
    aliyun::Ram::RemoveUserFromGroup
              ((RamRemoveUserFromGroupRequestType *)pHVar4,
               (RamRemoveUserFromGroupResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_53();
LAB_00112b51:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"AccountAlias");
    aliyun::Ram::SetAccountAlias
              ((RamSetAccountAliasRequestType *)pHVar4,
               (RamSetAccountAliasResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_54();
LAB_00112c55:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"PolicyName");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"VersionId");
    aliyun::Ram::SetDefaultPolicyVersion
              ((RamSetDefaultPolicyVersionRequestType *)pHVar4,
               (RamSetDefaultPolicyVersionResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_55();
LAB_00112d6d:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "{  \"PasswordPolicy\": {    \"MinimumPasswordLength\": 0,    \"RequireLowercaseCharacters\": true,    \"RequireUppercaseCharacters\": true,    \"RequireNumbers\": true,    \"RequireSymbols\": true  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"MinimumPasswordLength");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"RequireLowercaseCharacters");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"RequireUppercaseCharacters");
    std::__cxx11::string::operator=((string *)local_1b8._M_local_buf,"RequireNumbers");
    std::__cxx11::string::operator=((string *)local_198._M_local_buf,"RequireSymbols");
    aliyun::Ram::SetPasswordPolicy
              ((RamSetPasswordPolicyRequestType *)pHVar4,
               (RamSetPasswordPolicyResponseType *)&local_218._M_allocated_capacity,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_56();
LAB_00112ec6:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "{  \"SecurityPreference\": {    \"LoginProfilePreference\": {      \"EnableSaveMFATicket\": true    }  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"EnableSaveMFATicket");
    aliyun::Ram::SetSecurityPreference
              ((RamSetSecurityPreferenceRequestType *)pHVar4,
               (RamSetSecurityPreferenceResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_57();
LAB_00112fcf:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    aliyun::Ram::UnbindMFADevice
              ((RamUnbindMFADeviceRequestType *)pHVar4,
               (RamUnbindMFADeviceResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_58();
LAB_001130d3:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"UserAccessKeyId");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"Status");
    aliyun::Ram::UpdateAccessKey
              ((RamUpdateAccessKeyRequestType *)pHVar4,
               (RamUpdateAccessKeyResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_59();
LAB_001131ff:
    local_278._16_2_ = 0x3231;
    local_278[0x12] = '7';
    local_278._19_4_ = 0x302e302e;
    local_278[0x17] = '.';
    local_278._24_7_ = 0x34333232313a31;
    local_278._8_8_ = (pointer)0xf;
    local_278[0x1f] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)pHVar4,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar4->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar4->request_url_)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    paVar2 = &local_228;
    local_238._M_allocated_capacity = (size_type)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Group\": {    \"GroupName\": \"GroupName\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != paVar2) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_f8,"GroupName");
    std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"NewGroupName");
    std::__cxx11::string::operator=((string *)local_b8._M_local_buf,"NewComments");
    aliyun::Ram::UpdateGroup
              ((RamUpdateGroupRequestType *)pHVar4,(RamUpdateGroupResponseType *)local_f8,
               (RamErrorInfo *)local_218._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_60();
LAB_00113340:
    local_248._M_allocated_capacity._0_2_ = 0x3231;
    local_248._M_local_buf[2] = '7';
    local_248._M_allocated_capacity._3_4_ = 0x302e302e;
    local_248._M_local_buf[7] = '.';
    local_248._M_local_buf[8] = '1';
    local_248._M_local_buf[9] = ':';
    local_248._10_5_ = 0x3433323231;
    local_258._8_8_ = 0xf;
    local_248._M_local_buf[0xf] = '\0';
    local_258._M_allocated_capacity = (size_type)&local_248;
    aliyun::Ram::SetProxyHost((Ram *)paVar2->_M_local_buf,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      CONCAT17(local_248._M_local_buf[7],
                               CONCAT43(local_248._M_allocated_capacity._3_4_,
                                        CONCAT12(local_248._M_local_buf[2],
                                                 local_248._M_allocated_capacity._0_2_))) + 1);
    }
    if (paVar2->_M_local_buf[0x28] == '\x01') {
      paVar2->_M_local_buf[0x29] = '\0';
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_278._16_2_ = 0x7d7b;
    local_278._8_8_ = (pointer)0x2;
    local_278[0x12] = '\0';
    local_278._0_8_ = (pointer)(local_278 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,
                      CONCAT17(local_278[0x17],
                               CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"UserName");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"Password");
    std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),"PasswordResetRequired");
    std::__cxx11::string::operator=((string *)local_1b8._M_local_buf,"MFABindRequired");
    aliyun::Ram::UpdateLoginProfile
              ((RamUpdateLoginProfileRequestType *)paVar2,
               (RamUpdateLoginProfileResponseType *)local_218._M_local_buf,
               (RamErrorInfo *)local_238._M_local_buf);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_61();
  }
  local_278._16_2_ = 0x3231;
  local_278[0x12] = '7';
  local_278._19_4_ = 0x302e302e;
  local_278[0x17] = '.';
  local_278._24_7_ = 0x34333232313a31;
  local_278._8_8_ = (pointer)0xf;
  local_278[0x1f] = '\0';
  local_278._0_8_ = (pointer)(local_278 + 0x10);
  aliyun::Ram::SetProxyHost((Ram *)paVar2->_M_local_buf,(string *)local_278);
  if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
    operator_delete((void *)local_278._0_8_,
                    CONCAT17(local_278[0x17],
                             CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_)))
                    + 1);
  }
  if (paVar2->_M_local_buf[0x28] == '\x01') {
    paVar2->_M_local_buf[0x29] = '\0';
  }
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  local_238._M_allocated_capacity = (size_type)&local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,
             "{  \"Role\": {    \"RoleId\": \"RoleId\",    \"RoleName\": \"RoleName\",    \"Arn\": \"Arn\",    \"Description\": \"Description\",    \"AssumeRolePolicyDocument\": \"AssumeRolePolicyDocument\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\"  }}"
             ,"");
  HttpTestListener::SetResponseBody(pHVar3,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_allocated_capacity != &local_228) {
    operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
  }
  HttpTestListener::Start(pHVar3);
  std::__cxx11::string::operator=((string *)local_f8,"RoleName");
  std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"NewAssumeRolePolicyDocument");
  aliyun::Ram::UpdateRole
            ((RamUpdateRoleRequestType *)paVar2,(RamUpdateRoleResponseType *)local_f8,
             (RamErrorInfo *)local_218._M_local_buf);
  HttpTestListener::WaitComplete(pHVar3);
  main_cold_62();
LAB_001135ad:
  local_278._16_2_ = 0x3231;
  local_278[0x12] = '7';
  local_278._19_4_ = 0x302e302e;
  local_278[0x17] = '.';
  local_278._24_7_ = 0x34333232313a31;
  local_278._8_8_ = (pointer)0xf;
  local_278[0x1f] = '\0';
  local_278._0_8_ = (pointer)(local_278 + 0x10);
  aliyun::Ram::SetProxyHost((Ram *)pHVar3,(string *)local_278);
  if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
    operator_delete((void *)local_278._0_8_,
                    CONCAT17(local_278[0x17],
                             CONCAT43(local_278._19_4_,CONCAT12(local_278[0x12],local_278._16_2_)))
                    + 1);
  }
  if ((char)(pHVar3->request_url_)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(pHVar3->request_url_)._M_string_length + 1) = 0;
  }
  pHVar4 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar4,0x2fca);
  local_238._M_allocated_capacity = (size_type)&local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,
             "{  \"User\": {    \"UserId\": \"UserId\",    \"UserName\": \"UserName\",    \"DisplayName\": \"DisplayName\",    \"MobilePhone\": \"MobilePhone\",    \"Email\": \"Email\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\"  }}"
             ,"");
  HttpTestListener::SetResponseBody(pHVar4,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_allocated_capacity != &local_228) {
    operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
  }
  HttpTestListener::Start(pHVar4);
  std::__cxx11::string::operator=((string *)local_f8,"UserName");
  std::__cxx11::string::operator=((string *)local_d8._M_local_buf,"NewUserName");
  std::__cxx11::string::operator=((string *)local_b8._M_local_buf,"NewDisplayName");
  std::__cxx11::string::operator=((string *)local_98._M_local_buf,"NewMobilePhone");
  std::__cxx11::string::operator=((string *)local_78._M_local_buf,"NewEmail");
  std::__cxx11::string::operator=((string *)local_58._M_local_buf,"NewComments");
  aliyun::Ram::UpdateUser
            ((RamUpdateUserRequestType *)pHVar3,(RamUpdateUserResponseType *)local_f8,
             (RamErrorInfo *)local_218._M_local_buf);
  HttpTestListener::WaitComplete(pHVar4);
  main_cold_63();
  aliyun::RamUpdateUserUserType::~RamUpdateUserUserType((RamUpdateUserUserType *)&local_218);
  aliyun::RamUpdateUserRequestType::~RamUpdateUserRequestType((RamUpdateUserRequestType *)local_f8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_activate_service();
  test_add_user_to_group();
  test_attach_policy_to_group();
  test_attach_policy_to_role();
  test_attach_policy_to_user();
  test_bind_mf_adevice();
  test_clear_account_alias();
  test_create_access_key();
  test_create_group();
  test_create_login_profile();
  test_create_policy();
  test_create_policy_version();
  test_create_role();
  test_create_user();
  test_create_virtual_mf_adevice();
  test_deactivate_service();
  test_delete_access_key();
  test_delete_group();
  test_delete_login_profile();
  test_delete_policy();
  test_delete_policy_version();
  test_delete_role();
  test_delete_user();
  test_delete_virtual_mf_adevice();
  test_detach_policy_from_group();
  test_detach_policy_from_role();
  test_detach_policy_from_user();
  test_get_account_alias();
  test_get_account_summary();
  test_get_group();
  test_get_login_profile();
  test_get_password_policy();
  test_get_policy();
  test_get_policy_version();
  test_get_role();
  test_get_security_preference();
  test_get_service_status();
  test_get_user();
  test_get_user_mf_ainfo();
  test_list_access_keys();
  test_list_entities_for_policy();
  test_list_groups();
  test_list_groups_for_user();
  test_list_policies();
  test_list_policies_for_group();
  test_list_policies_for_role();
  test_list_policies_for_user();
  test_list_policy_versions();
  test_list_roles();
  test_list_users();
  test_list_users_for_group();
  test_list_virtual_mf_adevices();
  test_remove_user_from_group();
  test_set_account_alias();
  test_set_default_policy_version();
  test_set_password_policy();
  test_set_security_preference();
  test_unbind_mf_adevice();
  test_update_access_key();
  test_update_group();
  test_update_login_profile();
  test_update_role();
  test_update_user();
}